

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

void av1_ml_predict_breakout
               (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,uint pb_source_variance,int bit_depth
               ,PartitionSearchState *part_state)

{
  byte bVar1;
  _Bool _Var2;
  uint in_ECX;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  char in_R8B;
  long in_R9;
  float score;
  int dc_q;
  float dist_f;
  float rate_f;
  int num_pels_log2;
  int feature_index;
  float features [4];
  float ml_predict_breakout_thresh_scale [3];
  int thresh;
  NN_CONFIG *nn_config;
  int in_stack_00000078;
  int in_stack_0000007c;
  BLOCK_SIZE bsize;
  int mi_col;
  int mi_row;
  PartitionBlkParams *blk_params;
  int *in_stack_00002a88;
  int *in_stack_00002a90;
  float *in_stack_00002a98;
  int in_stack_00002aa4;
  ExtPartController *in_stack_00002aa8;
  long local_98;
  int local_8c;
  float local_80;
  int local_7c;
  float local_78;
  float local_74;
  uint local_70;
  undefined4 local_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58 [3];
  int local_4c;
  NN_CONFIG *local_48;
  byte local_39;
  undefined4 local_38;
  undefined4 local_34;
  long local_30;
  long local_28;
  long local_8;
  
  local_30 = in_R9 + 8;
  local_34 = *(undefined4 *)(in_R9 + 0xc);
  local_38 = *(undefined4 *)(in_R9 + 0x10);
  local_39 = *(byte *)(in_R9 + 0x30);
  local_48 = (NN_CONFIG *)0x0;
  local_4c = 0;
  switch(local_39) {
  case 3:
    local_48 = &av1_partition_breakout_nnconfig_8;
    local_4c = *(int *)(in_RDI + 0x6097c);
    break;
  default:
    break;
  case 6:
    local_48 = &av1_partition_breakout_nnconfig_16;
    local_4c = *(int *)(in_RDI + 0x60980);
    break;
  case 9:
    local_48 = &av1_partition_breakout_nnconfig_32;
    local_4c = *(int *)(in_RDI + 0x60984);
    break;
  case 0xc:
    local_48 = &av1_partition_breakout_nnconfig_64;
    local_4c = *(int *)(in_RDI + 0x60988);
    break;
  case 0xf:
    local_48 = &av1_partition_breakout_nnconfig_128;
    local_4c = *(int *)(in_RDI + 0x6098c);
  }
  if ((local_48 != (NN_CONFIG *)0x0) && (-1 < local_4c)) {
    local_58[0] = 1.15;
    local_58[1] = 1.05;
    local_58[2] = 1.0;
    local_4c = (int)((float)local_4c * local_58[*(int *)(in_RDI + 0x609c8) + -1]);
    bVar1 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[local_39];
    local_70 = (uint)bVar1;
    if (*in_RDX < 0x7fffffff) {
      local_8c = *in_RDX;
    }
    else {
      local_8c = 0x7fffffff;
    }
    local_74 = ((((float)*(int *)(in_RSI + 0x4218) / 128.0) / 512.0) / (float)(1 << (bVar1 & 0x1f)))
               * (float)local_8c;
    if (*(long *)(in_RDX + 2) < 0x7fffffff) {
      local_98 = *(long *)(in_RDX + 2);
    }
    else {
      local_98 = 0x7fffffff;
    }
    local_78 = (float)(local_98 >> (bVar1 & 0x3f));
    fStack_60 = (float)in_ECX;
    local_7c = (int)**(short **)(in_RSI + 0x80) >> (in_R8B - 8U & 0x1f);
    fStack_5c = (float)(local_7c * local_7c) / 256.0;
    local_6c = 4;
    local_28 = in_R9;
    local_8 = in_RDI;
    local_68 = local_74;
    fStack_64 = local_78;
    write_features_to_file
              ((char *)part_state,blk_params._7_1_,_mi_col,in_stack_0000007c,in_stack_00000078,
               nn_config._7_1_,(int)rd_stats,(int)x);
    frame_is_intra_only((AV1_COMMON *)(local_8 + 0x3bf80));
    _Var2 = ext_ml_model_decision_after_none
                      (in_stack_00002aa8,in_stack_00002aa4,in_stack_00002a98,in_stack_00002a90,
                       in_stack_00002a88);
    if (!_Var2) {
      local_80 = 0.0;
      (*av1_nn_predict)(&local_68,local_48,1,&local_80);
      if (local_4c <= (int)(local_80 * 100.0)) {
        *(undefined4 *)(local_28 + 300) = 0;
        *(undefined4 *)(local_28 + 0x128) = 0;
      }
    }
  }
  return;
}

Assistant:

void av1_ml_predict_breakout(AV1_COMP *const cpi, const MACROBLOCK *const x,
                             const RD_STATS *const rd_stats,
                             unsigned int pb_source_variance, int bit_depth,
                             PartitionSearchState *part_state) {
  const PartitionBlkParams *blk_params = &part_state->part_blk_params;
  const int mi_row = blk_params->mi_row, mi_col = blk_params->mi_col;
  const BLOCK_SIZE bsize = blk_params->bsize;

  const NN_CONFIG *nn_config = NULL;
  int thresh = 0;
  switch (bsize) {
    case BLOCK_8X8:
      nn_config = &av1_partition_breakout_nnconfig_8;
      thresh = cpi->sf.part_sf.ml_partition_search_breakout_thresh[0];
      break;
    case BLOCK_16X16:
      nn_config = &av1_partition_breakout_nnconfig_16;
      thresh = cpi->sf.part_sf.ml_partition_search_breakout_thresh[1];
      break;
    case BLOCK_32X32:
      nn_config = &av1_partition_breakout_nnconfig_32;
      thresh = cpi->sf.part_sf.ml_partition_search_breakout_thresh[2];
      break;
    case BLOCK_64X64:
      nn_config = &av1_partition_breakout_nnconfig_64;
      thresh = cpi->sf.part_sf.ml_partition_search_breakout_thresh[3];
      break;
    case BLOCK_128X128:
      nn_config = &av1_partition_breakout_nnconfig_128;
      thresh = cpi->sf.part_sf.ml_partition_search_breakout_thresh[4];
      break;
    default: assert(0 && "Unexpected bsize.");
  }
  if (!nn_config || thresh < 0) return;

  const float ml_predict_breakout_thresh_scale[3] = { 1.15f, 1.05f, 1.0f };
  thresh = (int)((float)thresh *
                 ml_predict_breakout_thresh_scale
                     [cpi->sf.part_sf.ml_predict_breakout_level - 1]);

  // Generate feature values.
  float features[FEATURES];
  int feature_index = 0;

  const int num_pels_log2 = num_pels_log2_lookup[bsize];
  float rate_f = (float)AOMMIN(rd_stats->rate, INT_MAX);
  rate_f = ((float)x->rdmult / 128.0f / 512.0f / (float)(1 << num_pels_log2)) *
           rate_f;
  features[feature_index++] = rate_f;

  const float dist_f =
      (float)(AOMMIN(rd_stats->dist, INT_MAX) >> num_pels_log2);
  features[feature_index++] = dist_f;

  features[feature_index++] = (float)pb_source_variance;

  const int dc_q = (int)x->plane[0].dequant_QTX[0] >> (bit_depth - 8);
  features[feature_index++] = (float)(dc_q * dc_q) / 256.0f;
  assert(feature_index == FEATURES);

  // Write features to file
  write_features_to_file(cpi->oxcf.partition_info_path,
                         cpi->ext_part_controller.test_mode, features, FEATURES,
                         2, bsize, mi_row, mi_col);

  if (ext_ml_model_decision_after_none(&cpi->ext_part_controller,
                                       frame_is_intra_only(&cpi->common),
                                       features, &part_state->do_square_split,
                                       &part_state->do_rectangular_split)) {
    return;
  }

  // Calculate score using the NN model.
  float score = 0.0f;
  av1_nn_predict(features, nn_config, 1, &score);

  // Make decision.
  if ((int)(score * 100) >= thresh) {
    part_state->do_square_split = 0;
    part_state->do_rectangular_split = 0;
  }
}